

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  SVectorBase<double> *pSVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  Nonzero<double> *pNVar5;
  pointer pdVar6;
  VarStatus *pVVar7;
  VarStatus *pVVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  VectorBase<double> *pVVar11;
  pointer pDVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint n;
  long in_FS_OFFSET;
  bool bVar17;
  bool bVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  DSVectorBase<double> slack;
  uint local_bc;
  DSVectorBase<double> local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  VectorBase<double> *local_48;
  VectorBase<double> *local_40;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_38;
  
  iVar2 = this->m_j;
  iVar3 = this->m_old_j;
  if (iVar2 != iVar3) {
    pdVar4 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar3] = pdVar4[iVar2];
    pdVar4 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar3] = pdVar4[iVar2];
    cStatus->data[iVar3] = cStatus->data[iVar2];
  }
  uVar16 = (this->m_col).super_SVectorBase<double>.memused;
  if (0 < (long)(int)uVar16) {
    pNVar5 = (this->m_col).super_SVectorBase<double>.m_elem;
    pdVar4 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar7 = rStatus->data;
    lVar15 = (long)(int)(this->m_old_i - uVar16);
    lVar13 = 0;
    do {
      iVar2 = (&pNVar5->idx)[lVar13];
      *(double *)((long)pdVar4 + lVar13 * 2 + lVar15 * 8 + 8) = pdVar4[iVar2];
      *(double *)((long)pdVar6 + lVar13 * 2 + lVar15 * 8 + 8) = pdVar6[iVar2];
      *(VarStatus *)((long)pVVar7 + lVar13 + lVar15 * 4 + 4) = pVVar7[iVar2];
      lVar13 = lVar13 + 4;
    } while ((long)(int)uVar16 * 4 - lVar13 != 0);
  }
  local_98.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  local_98.super_SVectorBase<double>.memsize = 0;
  local_98.super_SVectorBase<double>.memused = 0;
  local_98._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
  local_98.theelem = (Nonzero<double> *)0x0;
  n = 2;
  if (0 < (int)uVar16) {
    n = uVar16;
  }
  local_40 = r;
  spx_alloc<soplex::Nonzero<double>*>(&local_98.theelem,n);
  local_98.super_SVectorBase<double>.m_elem = local_98.theelem;
  local_98.super_SVectorBase<double>.memused = 0;
  local_98.super_SVectorBase<double>.memsize = n;
  local_48 = y;
  local_38 = cStatus;
  if (this->m_loFree == false) {
    ::soplex::infinity::__tls_init();
    dVar19 = -*(double *)(in_FS_OFFSET + -8);
    pDVar12 = (this->m_rows).data.
              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) >> 5) < 1) {
      local_bc = 0xffffffff;
    }
    else {
      pSVar1 = &(this->m_lRhs).super_SVectorBase<double>;
      local_bc = 0xffffffff;
      lVar13 = 0;
      do {
        lVar15 = (long)pDVar12[lVar13].super_SVectorBase<double>.memused;
        local_58 = 0.0;
        if (0 < lVar15) {
          pNVar5 = pDVar12[lVar13].super_SVectorBase<double>.m_elem;
          lVar14 = 0;
          do {
            iVar2 = *(int *)((long)&pNVar5->idx + lVar14);
            if (iVar2 != this->m_j) {
              local_58 = local_58 +
                         *(double *)((long)&pNVar5->val + lVar14) *
                         (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2];
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar15 * 0x10 != lVar14);
        }
        uStack_50 = 0;
        uVar16 = (uint)lVar13;
        dVar21 = SVectorBase<double>::operator[](pSVar1,uVar16);
        local_78._8_4_ = extraout_XMM0_Dc_01;
        local_78._0_8_ = dVar21;
        local_78._12_4_ = extraout_XMM0_Dd_01;
        dVar21 = SVectorBase<double>::operator[](pSVar1,uVar16);
        local_68._8_4_ = extraout_XMM0_Dc_02;
        local_68._0_8_ = dVar21;
        local_68._12_4_ = extraout_XMM0_Dd_02;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar21 = SVectorBase<double>::operator[]
                           (&pDVar12[lVar13].super_SVectorBase<double>,this->m_j);
        DSVectorBase<double>::makeMem(&local_98,1);
        if ((local_58 != 0.0) || (NAN(local_58))) {
          local_98.super_SVectorBase<double>.m_elem[local_98.super_SVectorBase<double>.memused].idx
               = uVar16;
          local_98.super_SVectorBase<double>.m_elem[local_98.super_SVectorBase<double>.memused].val
               = local_58;
          local_98.super_SVectorBase<double>.memused =
               local_98.super_SVectorBase<double>.memused + 1;
        }
        auVar24._8_8_ = local_58;
        auVar24._0_8_ = local_68._0_8_;
        dVar22 = ABS((double)local_78._0_8_);
        if (ABS((double)local_78._0_8_) <= ABS(local_58)) {
          dVar22 = ABS(local_58);
        }
        dVar20 = 1.0;
        if (1.0 <= dVar22) {
          dVar20 = dVar22;
        }
        auVar10._8_4_ = SUB84(dVar20,0);
        auVar10._0_8_ = dVar20;
        auVar10._12_4_ = (int)((ulong)dVar20 >> 0x20);
        auVar24 = divpd(auVar24,auVar10);
        dVar22 = auVar24._0_8_ - auVar24._8_8_;
        dVar21 = ((double)(~-(ulong)(ABS(dVar22) <=
                                    (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) &
                          (ulong)dVar22) * dVar20) / dVar21;
        if (dVar19 < dVar21) {
          local_bc = uVar16;
          dVar19 = dVar21;
        }
        lVar13 = lVar13 + 1;
        pDVar12 = (this->m_rows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar13 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pDVar12) >> 5));
    }
    dVar21 = this->m_bnd;
    bVar18 = dVar21 == dVar19;
    bVar17 = dVar21 < dVar19;
  }
  else {
    ::soplex::infinity::__tls_init();
    dVar19 = *(double *)(in_FS_OFFSET + -8);
    pDVar12 = (this->m_rows).data.
              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) >> 5) < 1) {
      local_bc = 0xffffffff;
    }
    else {
      pSVar1 = &(this->m_lRhs).super_SVectorBase<double>;
      local_bc = 0xffffffff;
      lVar13 = 0;
      do {
        lVar15 = (long)pDVar12[lVar13].super_SVectorBase<double>.memused;
        local_58 = 0.0;
        if (0 < lVar15) {
          pNVar5 = pDVar12[lVar13].super_SVectorBase<double>.m_elem;
          lVar14 = 0;
          do {
            iVar2 = *(int *)((long)&pNVar5->idx + lVar14);
            if (iVar2 != this->m_j) {
              local_58 = local_58 +
                         *(double *)((long)&pNVar5->val + lVar14) *
                         (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2];
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar15 * 0x10 != lVar14);
        }
        uStack_50 = 0;
        uVar16 = (uint)lVar13;
        dVar21 = SVectorBase<double>::operator[](pSVar1,uVar16);
        local_78._8_4_ = extraout_XMM0_Dc;
        local_78._0_8_ = dVar21;
        local_78._12_4_ = extraout_XMM0_Dd;
        dVar21 = SVectorBase<double>::operator[](pSVar1,uVar16);
        local_68._8_4_ = extraout_XMM0_Dc_00;
        local_68._0_8_ = dVar21;
        local_68._12_4_ = extraout_XMM0_Dd_00;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar21 = SVectorBase<double>::operator[]
                           (&pDVar12[lVar13].super_SVectorBase<double>,this->m_j);
        DSVectorBase<double>::makeMem(&local_98,1);
        if ((local_58 != 0.0) || (NAN(local_58))) {
          local_98.super_SVectorBase<double>.m_elem[local_98.super_SVectorBase<double>.memused].idx
               = uVar16;
          local_98.super_SVectorBase<double>.m_elem[local_98.super_SVectorBase<double>.memused].val
               = local_58;
          local_98.super_SVectorBase<double>.memused =
               local_98.super_SVectorBase<double>.memused + 1;
        }
        auVar23._8_8_ = local_58;
        auVar23._0_8_ = local_68._0_8_;
        dVar22 = ABS((double)local_78._0_8_);
        if (ABS((double)local_78._0_8_) <= ABS(local_58)) {
          dVar22 = ABS(local_58);
        }
        dVar20 = 1.0;
        if (1.0 <= dVar22) {
          dVar20 = dVar22;
        }
        auVar9._8_4_ = SUB84(dVar20,0);
        auVar9._0_8_ = dVar20;
        auVar9._12_4_ = (int)((ulong)dVar20 >> 0x20);
        auVar24 = divpd(auVar23,auVar9);
        dVar22 = auVar24._0_8_ - auVar24._8_8_;
        dVar21 = ((double)(~-(ulong)(ABS(dVar22) <=
                                    (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) &
                          (ulong)dVar22) * dVar20) / dVar21;
        if (dVar21 < dVar19) {
          local_bc = uVar16;
          dVar19 = dVar21;
        }
        lVar13 = lVar13 + 1;
        pDVar12 = (this->m_rows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar13 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pDVar12) >> 5));
    }
    dVar21 = this->m_bnd;
    bVar18 = dVar19 == dVar21;
    bVar17 = dVar19 < dVar21;
  }
  pdVar4 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar17 || bVar18) {
    pdVar4[this->m_j] = dVar19;
  }
  else {
    pdVar4[this->m_j] = dVar21;
    local_bc = 0xffffffff;
  }
  if (0 < (this->m_col).super_SVectorBase<double>.memused) {
    lVar13 = 8;
    lVar15 = 0;
    do {
      dVar19 = SVectorBase<double>::operator[](&local_98.super_SVectorBase<double>,(int)lVar15);
      pNVar5 = (this->m_col).super_SVectorBase<double>.m_elem;
      (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[*(int *)((long)&pNVar5->val + lVar13)] =
           *(double *)((long)pNVar5 + lVar13 + -8) *
           (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[this->m_j] + dVar19;
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar15 < (this->m_col).super_SVectorBase<double>.memused);
  }
  pVVar11 = local_48;
  (local_40->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->m_j] = 0.0;
  uVar16 = (this->m_col).super_SVectorBase<double>.memused;
  if (0 < (int)uVar16) {
    lVar15 = 8;
    lVar13 = 0;
    do {
      iVar2 = *(int *)((long)&((this->m_col).super_SVectorBase<double>.m_elem)->val + lVar15);
      dVar19 = SVectorBase<double>::operator[](&(this->m_rowObj).super_SVectorBase<double>,iVar2);
      (pVVar11->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = dVar19;
      lVar13 = lVar13 + 1;
      uVar16 = (this->m_col).super_SVectorBase<double>.memused;
      lVar15 = lVar15 + 0x10;
    } while (lVar13 < (int)uVar16);
  }
  if (0 < (int)uVar16) {
    pNVar5 = (this->m_col).super_SVectorBase<double>.m_elem;
    pVVar7 = rStatus->data;
    iVar2 = this->m_j;
    pVVar8 = local_38->data;
    bVar18 = this->m_loFree;
    lVar13 = 0;
    do {
      if ((ulong)local_bc << 4 == lVar13) {
        pVVar8[iVar2] = BASIC;
        dVar19 = *(double *)((long)&pNVar5->val + lVar13);
        if ((bVar18 & 1U) == 0) {
          bVar17 = 0.0 < dVar19;
        }
        else {
          bVar17 = dVar19 <= 0.0;
        }
        pVVar7[*(int *)((long)&pNVar5->idx + lVar13)] = (uint)bVar17;
      }
      else {
        pVVar7[*(int *)((long)&pNVar5->idx + lVar13)] = BASIC;
      }
      lVar13 = lVar13 + 0x10;
    } while ((ulong)uVar16 << 4 != lVar13);
  }
  if (local_bc == 0xffffffff) {
    local_38->data[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  local_98._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
  if (local_98.theelem != (Nonzero<double> *)0x0) {
    free(local_98.theelem);
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}